

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

uchar __thiscall
Assimp::StreamReader<true,_false>::Get<unsigned_char>(StreamReader<true,_false> *this)

{
  DeadlyImportError *this_00;
  Getter<true,_unsigned_char,_false> local_47;
  uchar local_46 [8];
  uchar f;
  allocator<char> local_31;
  string local_30;
  StreamReader<true,_false> *local_10;
  StreamReader<true,_false> *this_local;
  
  local_10 = this;
  if (this->limit < this->current + 1) {
    local_46[1] = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"End of file or stream limit was reached",&local_31);
    DeadlyImportError::DeadlyImportError(this_00,&local_30);
    local_46[1] = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_46[0] = *this->current;
  Intern::Getter<true,_unsigned_char,_false>::operator()(&local_47,local_46,(bool)(this->le & 1));
  this->current = this->current + 1;
  return local_46[0];
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }